

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scatterplot.cpp
# Opt level: O0

void Omega_h::write_linear_scatterplot<2>
               (string *path,Mesh *mesh,Int ent_dim,Reals *data,Vector<2> direction,Vector<2> origin
               ,string *separator)

{
  Read<double> local_e8;
  Read<double> local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  Read<double> local_a0;
  undefined1 local_90 [8];
  Reals coords_1d;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  Reals coords;
  string *separator_local;
  Reals *data_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  string *path_local;
  Vector<2> origin_local;
  Vector<2> direction_local;
  
  coords.write_.shared_alloc_.direct_ptr = separator;
  Mesh::coords((Mesh *)local_70);
  average_field((Omega_h *)local_60,mesh,ent_dim,2,(Reals *)local_70);
  Read<double>::~Read((Read<double> *)local_70);
  Read<double>::Read(&local_a0,(Read<double> *)local_60);
  local_c8 = origin.super_Few<double,_2>.array_[0];
  dStack_c0 = origin.super_Few<double,_2>.array_[1];
  local_b8 = direction.super_Few<double,_2>.array_[0];
  dStack_b0 = direction.super_Few<double,_2>.array_[1];
  get_linear_scatter_coords<2>((Reals *)local_90,direction,origin);
  Read<double>::~Read(&local_a0);
  Read<double>::Read(&local_d8,(Read<double> *)local_90);
  Read<double>::Read(&local_e8,data);
  write_scatterplot(path,mesh,ent_dim,&local_d8,&local_e8,
                    (string *)coords.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_e8);
  Read<double>::~Read(&local_d8);
  Read<double>::~Read((Read<double> *)local_90);
  Read<double>::~Read((Read<double> *)local_60);
  return;
}

Assistant:

void write_linear_scatterplot(std::string const& path, Mesh* mesh, Int ent_dim,
    Reals data, Vector<dim> direction, Vector<dim> origin,
    std::string const& separator) {
  auto coords =
      average_field(mesh, ent_dim, dim, mesh->coords());  // get centroids
  auto coords_1d = get_linear_scatter_coords(coords, direction, origin);
  write_scatterplot(path, mesh, ent_dim, coords_1d, data, separator);
}